

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer_by_key
          (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,per_timer_data *timer,op_queue<asio::detail::scheduler_operation> *ops,
          void *cancellation_key)

{
  bool bVar1;
  wait_op *pwVar2;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RCX;
  wait_op *in_RSI;
  op_queue<asio::detail::wait_op> *in_RDI;
  wait_op *op;
  op_queue<asio::detail::wait_op> other_ops;
  wait_op *in_stack_ffffffffffffffa8;
  op_queue<asio::detail::wait_op> *in_stack_ffffffffffffffb8;
  op_queue<asio::detail::wait_op> *in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffd0;
  per_timer_data *in_stack_ffffffffffffffd8;
  
  if (((in_RSI->ec_)._M_cat != (error_category *)0x0) || (in_RSI == in_RDI[1].front_)) {
    op_queue<asio::detail::wait_op>::op_queue(in_RDI);
    while (pwVar2 = op_queue<asio::detail::wait_op>::front
                              ((op_queue<asio::detail::wait_op> *)in_RSI), pwVar2 != (wait_op *)0x0)
    {
      op_queue<asio::detail::wait_op>::pop(in_RDI);
      if ((timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *)pwVar2->cancellation_key_ == in_RCX) {
        std::error_code::operator=(in_stack_ffffffffffffffd0,(basic_errors)((ulong)pwVar2 >> 0x20));
        op_queue<asio::detail::scheduler_operation>::push
                  ((op_queue<asio::detail::scheduler_operation> *)in_RDI,
                   &in_stack_ffffffffffffffa8->super_operation);
      }
      else {
        op_queue<asio::detail::wait_op>::push(in_RDI,in_stack_ffffffffffffffa8);
      }
    }
    op_queue<asio::detail::wait_op>::push<asio::detail::wait_op>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    bVar1 = op_queue<asio::detail::wait_op>::empty((op_queue<asio::detail::wait_op> *)in_RSI);
    if (bVar1) {
      remove_timer(in_RCX,in_stack_ffffffffffffffd8);
    }
    op_queue<asio::detail::wait_op>::~op_queue(in_RDI);
  }
  return;
}

Assistant:

void cancel_timer_by_key(per_timer_data* timer,
      op_queue<operation>& ops, void* cancellation_key)
  {
    if (timer->prev_ != 0 || timer == timers_)
    {
      op_queue<wait_op> other_ops;
      while (wait_op* op = timer->op_queue_.front())
      {
        timer->op_queue_.pop();
        if (op->cancellation_key_ == cancellation_key)
        {
          op->ec_ = asio::error::operation_aborted;
          ops.push(op);
        }
        else
          other_ops.push(op);
      }
      timer->op_queue_.push(other_ops);
      if (timer->op_queue_.empty())
        remove_timer(*timer);
    }
  }